

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O1

void __thiscall
nonstd::optional_lite::detail::storage_t<tinyusdz::Payload>::construct_value
          (storage_t<tinyusdz::Payload> *this,value_type *v)

{
  pointer pcVar1;
  double dVar2;
  
  *(storage_t<tinyusdz::Payload> **)this = this + 0x10;
  pcVar1 = (v->asset_path).asset_path_._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (v->asset_path).asset_path_._M_string_length);
  *(storage_t<tinyusdz::Payload> **)(this + 0x20) = this + 0x30;
  pcVar1 = (v->asset_path).resolved_path_._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(this + 0x20),pcVar1,pcVar1 + (v->asset_path).resolved_path_._M_string_length
            );
  tinyusdz::Path::Path((Path *)(this + 0x40),&v->prim_path);
  dVar2 = (v->layerOffset)._scale;
  *(double *)(this + 0x110) = (v->layerOffset)._offset;
  *(double *)(this + 0x118) = dVar2;
  return;
}

Assistant:

void construct_value( value_type const & v )
    {
        ::new( value_ptr() ) value_type( v );
    }